

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_maps(void)

{
  uint32_t uVar1;
  int iVar2;
  ptrdiff_t pVar3;
  char *pcVar4;
  char *d;
  ptrdiff_t sz;
  char *local_d8;
  char *d2_8;
  char *d1_8;
  char *local_c0;
  char *d2_7;
  char *d1_7;
  char *local_a8;
  char *d2_6;
  char *d1_6;
  char *local_90;
  char *d2_5;
  char *d1_5;
  char *local_78;
  char *d2_4;
  char *d1_4;
  char *local_60;
  char *d2_3;
  char *d1_3;
  char *local_48;
  char *d2_2;
  char *d1_2;
  char *local_30;
  char *d2_1;
  char *d1_1;
  char *local_18;
  char *d2;
  char *d1;
  
  _plan(0x3f,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n");
  d2 = mp_encode_map(data,0);
  local_18 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"map 0");
  d1_1._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_map(data,d2);
  _ok((uint)(pVar3 == 0),"mp_check_map(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x19f,
      "mp_check_map(0) == 0");
  uVar1 = mp_decode_map(&local_18);
  _ok((uint)(uVar1 == 0),"mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (0)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x19f,
      "mp_decode(mp_encode(0)) == 0");
  _ok((uint)((long)d2 - (long)data == 1),"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x19f,
      "len(mp_encode_map(0)");
  _ok((uint)(d2 == local_18),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x19f,
      "len(mp_decode_map(0))");
  uVar1 = mp_sizeof_map(0);
  _ok((uint)(uVar1 == 1),"mp_sizeof_map(0) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x19f,
      "mp_sizeof_map(0)");
  iVar2 = memcmp(data,anon_var_dwarf_1566 + 1,1);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\x80\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x19f,
      "mp_encode(0) == \"\\x80\"");
  d2_1 = mp_encode_map(data,1);
  local_30 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"map 1");
  d1_2._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_map(data,d2_1);
  _ok((uint)(pVar3 == 0),"mp_check_map(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a0,
      "mp_check_map(1) == 0");
  uVar1 = mp_decode_map(&local_30);
  _ok((uint)(uVar1 == 1),"mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a0,
      "mp_decode(mp_encode(1)) == 1");
  _ok((uint)((long)d2_1 - (long)data == 1),"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a0,
      "len(mp_encode_map(1)");
  _ok((uint)(d2_1 == local_30),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a0,
      "len(mp_decode_map(1))");
  uVar1 = mp_sizeof_map(1);
  _ok((uint)(uVar1 == 1),"mp_sizeof_map(1) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a0,
      "mp_sizeof_map(1)");
  iVar2 = memcmp(data,anon_var_dwarf_2167 + 1,1);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\x81\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a0,
      "mp_encode(1) == \"\\x81\"");
  d2_2 = mp_encode_map(data,0xf);
  local_48 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"map 15");
  d1_3._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_map(data,d2_2);
  _ok((uint)(pVar3 == 0),"mp_check_map(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a1,
      "mp_check_map(15) == 0");
  uVar1 = mp_decode_map(&local_48);
  _ok((uint)(uVar1 == 0xf),"mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (15)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a1,
      "mp_decode(mp_encode(15)) == 15");
  _ok((uint)((long)d2_2 - (long)data == 1),"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a1,
      "len(mp_encode_map(15)");
  _ok((uint)(d2_2 == local_48),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a1,
      "len(mp_decode_map(15))");
  uVar1 = mp_sizeof_map(0xf);
  _ok((uint)(uVar1 == 1),"mp_sizeof_map(15) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a1,
      "mp_sizeof_map(15)");
  iVar2 = memcmp(data,anon_var_dwarf_6f2f,1);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\x8f\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a1,
      "mp_encode(15) == \"\\x8f\"");
  d2_3 = mp_encode_map(data,0x10);
  local_60 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"map 16");
  d1_4._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_map(data,d2_3);
  _ok((uint)(pVar3 == 0),"mp_check_map(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a2,
      "mp_check_map(16) == 0");
  uVar1 = mp_decode_map(&local_60);
  _ok((uint)(uVar1 == 0x10),"mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (16)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a2,
      "mp_decode(mp_encode(16)) == 16");
  _ok((uint)((long)d2_3 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a2,
      "len(mp_encode_map(16)");
  _ok((uint)(d2_3 == local_60),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a2,
      "len(mp_decode_map(16))");
  uVar1 = mp_sizeof_map(0x10);
  _ok((uint)(uVar1 == 3),"mp_sizeof_map(16) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a2,
      "mp_sizeof_map(16)");
  iVar2 = memcmp(data,anon_var_dwarf_6fa7,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xde\\x00\\x10\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a2,
      "mp_encode(16) == \"\\xde\\x00\\x10\"");
  d2_4 = mp_encode_map(data,0xfffe);
  local_78 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"map 0xfffe");
  d1_5._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_map(data,d2_4);
  _ok((uint)(pVar3 == 0),"mp_check_map(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a3,
      "mp_check_map(0xfffe) == 0");
  uVar1 = mp_decode_map(&local_78);
  _ok((uint)(uVar1 == 0xfffe),"mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (0xfffe)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a3,
      "mp_decode(mp_encode(0xfffe)) == 0xfffe");
  _ok((uint)((long)d2_4 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a3,
      "len(mp_encode_map(0xfffe)");
  _ok((uint)(d2_4 == local_78),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a3,
      "len(mp_decode_map(0xfffe))");
  uVar1 = mp_sizeof_map(0xfffe);
  _ok((uint)(uVar1 == 3),"mp_sizeof_map(0xfffe) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a3,
      "mp_sizeof_map(0xfffe)");
  iVar2 = memcmp(data,anon_var_dwarf_701f,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xde\\xff\\xfe\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a3,
      "mp_encode(0xfffe) == \"\\xde\\xff\\xfe\"");
  d2_5 = mp_encode_map(data,0xffff);
  local_90 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"map 0xffff");
  d1_6._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_map(data,d2_5);
  _ok((uint)(pVar3 == 0),"mp_check_map(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a4,
      "mp_check_map(0xffff) == 0");
  uVar1 = mp_decode_map(&local_90);
  _ok((uint)(uVar1 == 0xffff),"mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (0xffff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a4,
      "mp_decode(mp_encode(0xffff)) == 0xffff");
  _ok((uint)((long)d2_5 - (long)data == 3),"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a4,
      "len(mp_encode_map(0xffff)");
  _ok((uint)(d2_5 == local_90),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a4,
      "len(mp_decode_map(0xffff))");
  uVar1 = mp_sizeof_map(0xffff);
  _ok((uint)(uVar1 == 3),"mp_sizeof_map(0xffff) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a4,
      "mp_sizeof_map(0xffff)");
  iVar2 = memcmp(data,anon_var_dwarf_7097,3);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xde\\xff\\xff\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a4,
      "mp_encode(0xffff) == \"\\xde\\xff\\xff\"");
  d2_6 = mp_encode_map(data,0x10000);
  local_a8 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"map 0x10000");
  d1_7._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_map(data,d2_6);
  _ok((uint)(pVar3 == 0),"mp_check_map(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a5,
      "mp_check_map(0x10000) == 0");
  uVar1 = mp_decode_map(&local_a8);
  _ok((uint)(uVar1 == 0x10000),"mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (0x10000)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a5,
      "mp_decode(mp_encode(0x10000)) == 0x10000");
  _ok((uint)((long)d2_6 - (long)data == 5),"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a5,
      "len(mp_encode_map(0x10000)");
  _ok((uint)(d2_6 == local_a8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a5,
      "len(mp_decode_map(0x10000))");
  uVar1 = mp_sizeof_map(0x10000);
  _ok((uint)(uVar1 == 5),"mp_sizeof_map(0x10000) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a5,
      "mp_sizeof_map(0x10000)");
  iVar2 = memcmp(data,anon_var_dwarf_710f,5);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xdf\\x00\\x01\\x00\\x00\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a5,
      "mp_encode(0x10000) == \"\\xdf\\x00\\x01\\x00\\x00\"");
  d2_7 = mp_encode_map(data,0xfffffffe);
  local_c0 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"map 0xfffffffeU");
  d1_8._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_map(data,d2_7);
  _ok((uint)(pVar3 == 0),"mp_check_map(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a6,
      "mp_check_map(0xfffffffeU) == 0");
  uVar1 = mp_decode_map(&local_c0);
  _ok((uint)(uVar1 == 0xfffffffe),"mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (0xfffffffeU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a6,
      "mp_decode(mp_encode(0xfffffffeU)) == 0xfffffffeU");
  _ok((uint)((long)d2_7 - (long)data == 5),"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a6,
      "len(mp_encode_map(0xfffffffeU)");
  _ok((uint)(d2_7 == local_c0),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a6,
      "len(mp_decode_map(0xfffffffeU))");
  uVar1 = mp_sizeof_map(0xfffffffe);
  _ok((uint)(uVar1 == 5),"mp_sizeof_map(0xfffffffeU) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a6,
      "mp_sizeof_map(0xfffffffeU)");
  iVar2 = memcmp(data,anon_var_dwarf_7187,5);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xdf\\xff\\xff\\xff\\xfe\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a6,
      "mp_encode(0xfffffffeU) == \"\\xdf\\xff\\xff\\xff\\xfe\"");
  d2_8 = mp_encode_map(data,0xffffffff);
  local_d8 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"map 0xffffffffU");
  sz._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_map(data,d2_8);
  _ok((uint)(pVar3 == 0),"mp_check_map(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a7,
      "mp_check_map(0xffffffffU) == 0");
  uVar1 = mp_decode_map(&local_d8);
  _ok((uint)(uVar1 == 0xffffffff),"mp_decode_map(&d2 COMPLEX(COMMA &ext_type)) == (0xffffffffU)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a7,
      "mp_decode(mp_encode(0xffffffffU)) == 0xffffffffU");
  _ok((uint)((long)d2_8 - (long)data == 5),"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a7,
      "len(mp_encode_map(0xffffffffU)");
  _ok((uint)(d2_8 == local_d8),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a7,
      "len(mp_decode_map(0xffffffffU))");
  uVar1 = mp_sizeof_map(0xffffffff);
  _ok((uint)(uVar1 == 5),"mp_sizeof_map(0xffffffffU) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a7,
      "mp_sizeof_map(0xffffffffU)");
  iVar2 = memcmp(data,anon_var_dwarf_71ff,5);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xdf\\xff\\xff\\xff\\xff\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a7,
      "mp_encode(0xffffffffU) == \"\\xdf\\xff\\xff\\xff\\xff\"");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"map_safe");
  sz._0_4_ = fprintf(_stdout,"\n");
  d = (char *)0x0;
  pcVar4 = mp_encode_map_safe((char *)0x0,(ptrdiff_t *)&d,0xfffffffe);
  _ok((uint)(d == (char *)0xfffffffffffffffb),"-sz == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a9,
      "size after mp_encode_map_safe(NULL, &sz)");
  _ok((uint)(pcVar4 == (char *)0x0),"d == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a9,
      "mp_encode_map_safe(NULL, &sz)");
  d = (char *)0x5;
  pcVar4 = mp_encode_map_safe(data,(ptrdiff_t *)&d,0xfffffffe);
  _ok((uint)(d == (char *)0x0),"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a9,
      "size after mp_encode_map_safe(buf, &sz)");
  _ok((uint)((long)pcVar4 - (long)data == 5),"(d - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a9,
      "len of mp_encode_map_safe(buf, &sz)");
  iVar2 = memcmp(data,anon_var_dwarf_7187,5);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xdf\\xff\\xff\\xff\\xfe\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a9,
      "mp_encode_map_safe(buf, &sz)");
  d = (char *)0x4;
  pcVar4 = mp_encode_map_safe(data,(ptrdiff_t *)&d,0xfffffffe);
  _ok((uint)(d == (char *)0xffffffffffffffff),"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a9,
      "size after mp_encode_map_safe(buf, &sz) overflow");
  _ok((uint)(pcVar4 == data),"d == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a9,
      "mp_encode_map_safe(buf, &sz) overflow");
  pcVar4 = mp_encode_map_safe(data,(ptrdiff_t *)0x0,0xfffffffe);
  _ok((uint)((long)pcVar4 - (long)data == 5),"(d - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a9,
      "len of mp_encode_map_safe(buf, NULL)");
  iVar2 = memcmp(data,anon_var_dwarf_7187,5);
  _ok((uint)(iVar2 == 0),"memcmp(data, (\"\\xdf\\xff\\xff\\xff\\xfe\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x1a9,
      "mp_encode_map_safe(buf, NULL)");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_maps");
  iVar2 = check_plan();
  return iVar2;
}

Assistant:

static int
test_maps(void)
{
	plan(9*6 + 9);
	header();

	test_map(0, "\x80", 1);
	test_map(1, "\x81", 1);
	test_map(15, "\x8f", 1);
	test_map(16, "\xde\x00\x10", 3);
	test_map(0xfffe, "\xde\xff\xfe", 3);
	test_map(0xffff, "\xde\xff\xff", 3);
	test_map(0x10000, "\xdf\x00\x01\x00\x00", 5);
	test_map(0xfffffffeU, "\xdf\xff\xff\xff\xfe", 5);
	test_map(0xffffffffU, "\xdf\xff\xff\xff\xff", 5);

	test_map_safe(0xfffffffeU, "\xdf\xff\xff\xff\xfe", 5);

	footer();
	return check_plan();
}